

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sceneRender.cpp
# Opt level: O2

void __thiscall SceneRender::printDefines(SceneRender *this)

{
  Model *pMVar1;
  ostream *poVar2;
  size_t i;
  ulong uVar3;
  
  if (this->m_background == true) {
    poVar2 = std::operator<<((ostream *)&std::cout,".");
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<((ostream *)&std::cout,"| BACKGROUND");
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<((ostream *)&std::cout,"+------------- ");
    std::endl<char,std::char_traits<char>>(poVar2);
    vera::HaveDefines::printDefines(&(this->m_background_shader).super_HaveDefines);
  }
  if (-1 < this->m_floor_subd) {
    poVar2 = std::operator<<((ostream *)&std::cout,".");
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<((ostream *)&std::cout,"| FLOOR");
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<((ostream *)&std::cout,"+------------- ");
    std::endl<char,std::char_traits<char>>(poVar2);
    (*(this->m_floor).mainShader.super_HaveDefines._vptr_HaveDefines[0x10])
              (&(this->m_floor).mainShader);
  }
  for (uVar3 = 0;
      uVar3 < (ulong)((long)(this->m_devlook_spheres).
                            super__Vector_base<vera::Model_*,_std::allocator<vera::Model_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->m_devlook_spheres).
                            super__Vector_base<vera::Model_*,_std::allocator<vera::Model_*>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 3); uVar3 = uVar3 + 1) {
    poVar2 = std::operator<<((ostream *)&std::cout,".");
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<((ostream *)&std::cout,"| DEVLOOK SPHERE ");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<((ostream *)&std::cout,"+------------- ");
    std::endl<char,std::char_traits<char>>(poVar2);
    pMVar1 = (this->m_devlook_spheres).
             super__Vector_base<vera::Model_*,_std::allocator<vera::Model_*>_>._M_impl.
             super__Vector_impl_data._M_start[uVar3];
    (*(pMVar1->mainShader).super_HaveDefines._vptr_HaveDefines[0x10])(&pMVar1->mainShader);
  }
  for (uVar3 = 0;
      uVar3 < (ulong)((long)(this->m_devlook_billboards).
                            super__Vector_base<vera::Model_*,_std::allocator<vera::Model_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->m_devlook_billboards).
                            super__Vector_base<vera::Model_*,_std::allocator<vera::Model_*>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 3); uVar3 = uVar3 + 1) {
    poVar2 = std::operator<<((ostream *)&std::cout,".");
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<((ostream *)&std::cout,"| DEVLOOK BILLBOARD ");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<((ostream *)&std::cout,"+------------- ");
    std::endl<char,std::char_traits<char>>(poVar2);
    pMVar1 = (this->m_devlook_billboards).
             super__Vector_base<vera::Model_*,_std::allocator<vera::Model_*>_>._M_impl.
             super__Vector_impl_data._M_start[uVar3];
    (*(pMVar1->mainShader).super_HaveDefines._vptr_HaveDefines[0x10])(&pMVar1->mainShader);
  }
  return;
}

Assistant:

void SceneRender::printDefines() {
    if (m_background) {
        std::cout << "." << std::endl;
        std::cout << "| BACKGROUND" << std::endl;
        std::cout << "+------------- " << std::endl;
        m_background_shader.printDefines();
    }

    if (m_floor_subd >= 0) {
        std::cout << "." << std::endl;
        std::cout << "| FLOOR" << std::endl;
        std::cout << "+------------- " << std::endl;
        m_floor.getShader()->printDefines();
    }

    for (size_t i = 0; i < m_devlook_spheres.size(); i++) {
        std::cout << "." << std::endl;
        std::cout << "| DEVLOOK SPHERE " << i << std::endl;
        std::cout << "+------------- " << std::endl;
        m_devlook_spheres[i]->getShader()->printDefines();
    }

    for (size_t i = 0; i < m_devlook_billboards.size(); i++) {
        std::cout << "." << std::endl;
        std::cout << "| DEVLOOK BILLBOARD " << i << std::endl;
        std::cout << "+------------- " << std::endl;
        m_devlook_billboards[i]->getShader()->printDefines();
    }
}